

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O2

int GetLatestDataNMEADevice(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  int *piVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  NMEADATA *pNVar18;
  size_t __n;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  char c2;
  char c1;
  int Bytes;
  char c0;
  char *local_19d0;
  char *local_19c8;
  NMEADATA *local_19c0;
  double *local_19b8;
  char *local_19b0;
  char *local_19a8;
  char *local_19a0;
  double *local_1998;
  char *local_1990;
  double *local_1988;
  double *local_1980;
  char *local_1978;
  char *local_1970;
  char *local_1968;
  char *local_1960;
  char *local_1958;
  char *local_1950;
  double *local_1948;
  double *local_1940;
  double *local_1938;
  char *local_1930;
  char *local_1928;
  char *local_1920;
  double f2;
  double f1;
  double f0;
  CHRONO chrono;
  char aisbuf [128];
  char recvbuf [4096];
  char savebuf [2048];
  
  Bytes = 0;
  c0 = '\0';
  f0 = 0.0;
  c1 = '\0';
  f1 = 0.0;
  c2 = '\0';
  f2 = 0.0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x1000);
  memset(savebuf,0,0x800);
  iVar12 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)recvbuf,0x7ff,&Bytes);
  if (iVar12 == 0) {
    local_19c0 = pNMEAData;
    if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,(long)Bytes,1,(FILE *)pNMEADevice->pfSaveFile);
      fflush((FILE *)pNMEADevice->pfSaveFile);
    }
    iVar12 = Bytes;
    if (0x7fe < Bytes) {
      while (iVar12 = Bytes, Bytes == 0x7ff) {
        dVar19 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar19) goto LAB_001460c6;
        memcpy(savebuf,recvbuf,(long)Bytes);
        iVar12 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)recvbuf,0x7ff,&Bytes);
        if (iVar12 != 0) goto LAB_00145ae6;
        if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(long)Bytes,1,(FILE *)pNMEADevice->pfSaveFile);
          fflush((FILE *)pNMEADevice->pfSaveFile);
        }
      }
      __n = (size_t)Bytes;
      memmove(recvbuf + (0x7ff - __n),recvbuf,__n);
      memcpy(recvbuf,savebuf + __n,(long)(0x7ff - iVar12));
      iVar12 = 0x7ff;
    }
    if (pNMEADevice->bEnableGPGGA == 0) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = FindLatestNMEASentence("$GPGGA",recvbuf);
    }
    if (pNMEADevice->bEnableGPRMC == 0) {
      local_19b0 = (char *)0x0;
    }
    else {
      local_19b0 = FindLatestNMEASentence("$GPRMC",recvbuf);
    }
    if (pNMEADevice->bEnableGPGLL == 0) {
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar14 = FindLatestNMEASentence("$GPGLL",recvbuf);
    }
    if (pNMEADevice->bEnableGPVTG == 0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = FindLatestNMEASentence("$GPVTG",recvbuf);
    }
    if (pNMEADevice->bEnableHCHDG == 0) {
      local_1950 = (char *)0x0;
    }
    else {
      local_1950 = FindLatestNMEASentence("$HCHDG",recvbuf);
    }
    if (pNMEADevice->bEnableIIMWV == 0) {
      local_1958 = (char *)0x0;
    }
    else {
      local_1958 = FindLatestNMEASentence("$IIMWV",recvbuf);
    }
    if (pNMEADevice->bEnableWIMWV == 0) {
      local_1960 = (char *)0x0;
    }
    else {
      local_1960 = FindLatestNMEASentence("$WIMWV",recvbuf);
    }
    if (pNMEADevice->bEnableWIMWD == 0) {
      local_1968 = (char *)0x0;
    }
    else {
      local_1968 = FindLatestNMEASentence("$WIMWD",recvbuf);
    }
    if (pNMEADevice->bEnableWIMDA == 0) {
      local_1970 = (char *)0x0;
    }
    else {
      local_1970 = FindLatestNMEASentence("$WIMDA",recvbuf);
    }
    local_1928 = pcVar15;
    local_1920 = pcVar14;
    if (pNMEADevice->bEnableAIVDM == 0) {
      local_1978 = (char *)0x0;
    }
    else {
      local_1978 = FindLatestNMEASentence("!AIVDM",recvbuf);
    }
LAB_00145e1e:
    pNVar18 = local_19c0;
    if ((((((((pNMEADevice->bEnableGPGGA == 0) || (pcVar17 != (char *)0x0)) &&
            ((pNMEADevice->bEnableGPRMC == 0 || (local_19b0 != (char *)0x0)))) &&
           ((pNMEADevice->bEnableGPGLL == 0 || (local_1920 != (char *)0x0)))) &&
          ((pNMEADevice->bEnableGPVTG == 0 || (local_1928 != (char *)0x0)))) &&
         ((((pNMEADevice->bEnableHCHDG == 0 || (local_1950 != (char *)0x0)) &&
           ((pNMEADevice->bEnableIIMWV == 0 || (local_1958 != (char *)0x0)))) &&
          ((pNMEADevice->bEnableWIMWV == 0 || (local_1960 != (char *)0x0)))))) &&
        ((pNMEADevice->bEnableWIMWD == 0 || (local_1968 != (char *)0x0)))) &&
       (((pNMEADevice->bEnableWIMDA == 0 || (local_1970 != (char *)0x0)) &&
        ((pNMEADevice->bEnableAIVDM == 0 || (local_1978 != (char *)0x0)))))) {
      memset(local_19c0,0,0x3d8);
      if (pNMEADevice->bEnableGPGGA != 0) {
        local_19c8 = pNVar18->szlatdeg;
        local_19d0 = pNVar18->szlongdeg;
        local_19a8 = pNVar18->szlatdeg + 1;
        local_1988 = &pNVar18->latmin;
        pcVar14 = &pNVar18->north;
        local_19a0 = pNVar18->szlongdeg + 1;
        local_1980 = (double *)(pNVar18->szlongdeg + 2);
        local_1998 = &pNVar18->longmin;
        local_1990 = &pNVar18->east;
        local_19b8 = (double *)&pNVar18->GPS_quality_indicator;
        local_1938 = (double *)&pNVar18->nbsat;
        local_1940 = &pNVar18->hdop;
        local_1948 = &pNVar18->Altitude;
        pNVar18->szlongdeg[0] = '\0';
        pNVar18->szlongdeg[1] = '\0';
        pNVar18->szlongdeg[2] = '\0';
        pNVar18->szlongdeg[3] = '\0';
        pNVar18->szlatdeg[0] = '\0';
        pNVar18->szlatdeg[1] = '\0';
        pNVar18->szlatdeg[2] = '\0';
        pNVar18->szlongdeg[0] = '\0';
        local_1930 = pcVar14;
        iVar12 = __isoc99_sscanf(pcVar17,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M",
                                 pNVar18);
        if ((((iVar12 == 0xf) ||
             (iVar12 = __isoc99_sscanf(pcVar17,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M",
                                       pNVar18,local_19c8,local_19a8,local_1988,pcVar14,local_19d0,
                                       local_19a0,local_1980,local_1998,local_1990,local_19b8,
                                       local_1938,local_1940,local_1948), iVar12 == 0xe)) ||
            (iVar12 = __isoc99_sscanf(pcVar17,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d",pNVar18,
                                      local_19c8,local_19a8,local_1988,pcVar14,local_19d0,local_19a0
                                      ,local_1980,local_1998,local_1990,local_19b8), iVar12 == 0xb))
           || ((iVar12 = __isoc99_sscanf(pcVar17,"$GPGGA,%lf,,,,,%d",pNVar18,local_19b8),
               iVar12 == 2 ||
               (iVar12 = __isoc99_sscanf(pcVar17,"$GPGGA,,,,,,%d",local_19b8), iVar12 == 1)))) {
          dVar19 = pNVar18->utc;
          if (0.0 < dVar19) {
            iVar12 = (int)dVar19 / 10000;
            pNVar18->hour = iVar12;
            iVar13 = iVar12 * -100 + (int)dVar19 / 100;
            pNVar18->minute = iVar13;
            pNVar18->second = (dVar19 - (double)(iVar12 * 10000)) - (double)(iVar13 * 100);
          }
          if ((*local_19c8 != '\0') && (*local_19d0 != '\0')) {
            iVar12 = atoi(local_19c8);
            pNVar18->latdeg = iVar12;
            iVar13 = atoi(local_19d0);
            pNVar18->longdeg = iVar13;
            uVar6 = pNVar18->north;
            uVar9 = pNVar18->east;
            auVar20[0] = -(uVar6 == 'N');
            auVar20[1] = -(uVar6 == 'N');
            auVar20[2] = -(uVar9 == 'E');
            auVar20[3] = -(uVar9 == 'E');
            auVar20[4] = 0xff;
            auVar20[5] = 0xff;
            auVar20[6] = 0xff;
            auVar20[7] = 0xff;
            auVar20[8] = 0xff;
            auVar20[9] = 0xff;
            auVar20[10] = 0xff;
            auVar20[0xb] = 0xff;
            auVar20[0xc] = 0xff;
            auVar20[0xd] = 0xff;
            auVar20[0xe] = 0xff;
            auVar20[0xf] = 0xff;
            auVar20 = pshuflw(auVar20,auVar20,0x50);
            auVar28._0_8_ = pNVar18->latmin;
            auVar28._8_8_ = pNVar18->longmin;
            auVar28 = divpd(auVar28,_DAT_0018d520);
            auVar21._0_8_ = CONCAT44(auVar20._0_4_,auVar20._0_4_);
            auVar21._8_4_ = auVar20._4_4_;
            auVar21._12_4_ = auVar20._4_4_;
            dVar19 = auVar28._0_8_ + (double)iVar12;
            dVar29 = auVar28._8_8_ + (double)iVar13;
            pNVar18->Latitude =
                 (double)(~auVar21._0_8_ & (ulong)-dVar19 | (ulong)dVar19 & auVar21._0_8_);
            pNVar18->Longitude =
                 (double)(~auVar21._8_8_ & (ulong)-dVar29 | (ulong)dVar29 & auVar21._8_8_);
          }
          goto LAB_0014640e;
        }
LAB_00146c8b:
        pcVar17 = "Error reading data from a NMEADevice : Invalid data. ";
        goto LAB_00145aed;
      }
LAB_0014640e:
      if (pNMEADevice->bEnableGPRMC != 0) {
        local_19c8 = pNVar18->szlatdeg;
        local_19d0 = pNVar18->szlongdeg;
        local_19a8 = &pNVar18->status;
        local_1988 = (double *)(pNVar18->szlatdeg + 1);
        pdVar2 = &pNVar18->latmin;
        pcVar17 = &pNVar18->north;
        local_1998 = (double *)(pNVar18->szlongdeg + 1);
        local_19a0 = pNVar18->szlongdeg + 2;
        local_19b8 = &pNVar18->longmin;
        local_1990 = &pNVar18->east;
        local_1938 = &pNVar18->sog;
        local_1940 = &pNVar18->cog;
        local_1948 = &pNVar18->date;
        pNVar18->szlongdeg[0] = '\0';
        pNVar18->szlongdeg[1] = '\0';
        pNVar18->szlongdeg[2] = '\0';
        pNVar18->szlongdeg[3] = '\0';
        pNVar18->szlatdeg[0] = '\0';
        pNVar18->szlatdeg[1] = '\0';
        pNVar18->szlatdeg[2] = '\0';
        pNVar18->szlongdeg[0] = '\0';
        local_1980 = pdVar2;
        local_1930 = pcVar17;
        iVar12 = __isoc99_sscanf(local_19b0,
                                 "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c",pNVar18)
        ;
        if ((((iVar12 != 0x10) &&
             (iVar12 = __isoc99_sscanf(local_19b0,
                                       "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf",pNVar18,
                                       local_19a8,local_19c8,local_1988,pdVar2,pcVar17,local_19d0,
                                       local_1998,local_19a0,local_19b8,local_1990,local_1938,
                                       local_1940,local_1948), iVar12 != 0xe)) &&
            (iVar12 = __isoc99_sscanf(local_19b0,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c",pNVar18,
                                      local_19a8,local_19c8,local_1988,pdVar2,pcVar17,local_19d0,
                                      local_1998,local_19a0,local_19b8,local_1990), iVar12 != 0xb))
           && ((iVar12 = __isoc99_sscanf(local_19b0,"$GPRMC,%lf,%c",pNVar18,local_19a8), iVar12 != 2
               && (iVar12 = __isoc99_sscanf(local_19b0,"$GPRMC,,%c",local_19a8), iVar12 != 1))))
        goto LAB_00146c8b;
        dVar19 = pNVar18->utc;
        if (0.0 < dVar19) {
          iVar12 = (int)dVar19 / 10000;
          pNVar18->hour = iVar12;
          iVar13 = iVar12 * -100 + (int)dVar19 / 100;
          pNVar18->minute = iVar13;
          pNVar18->second = (dVar19 - (double)(iVar12 * 10000)) - (double)(iVar13 * 100);
        }
        if ((*local_19c8 != '\0') && (*local_19d0 != '\0')) {
          iVar12 = atoi(local_19c8);
          pNVar18->latdeg = iVar12;
          iVar13 = atoi(local_19d0);
          pNVar18->longdeg = iVar13;
          uVar7 = pNVar18->north;
          uVar10 = pNVar18->east;
          auVar22[0] = -(uVar7 == 'N');
          auVar22[1] = -(uVar7 == 'N');
          auVar22[2] = -(uVar10 == 'E');
          auVar22[3] = -(uVar10 == 'E');
          auVar22[4] = 0xff;
          auVar22[5] = 0xff;
          auVar22[6] = 0xff;
          auVar22[7] = 0xff;
          auVar22[8] = 0xff;
          auVar22[9] = 0xff;
          auVar22[10] = 0xff;
          auVar22[0xb] = 0xff;
          auVar22[0xc] = 0xff;
          auVar22[0xd] = 0xff;
          auVar22[0xe] = 0xff;
          auVar22[0xf] = 0xff;
          auVar28 = pshuflw(auVar22,auVar22,0x50);
          auVar4._0_8_ = pNVar18->latmin;
          auVar4._8_8_ = pNVar18->longmin;
          auVar20 = divpd(auVar4,_DAT_0018d520);
          auVar23._0_8_ = CONCAT44(auVar28._0_4_,auVar28._0_4_);
          auVar23._8_4_ = auVar28._4_4_;
          auVar23._12_4_ = auVar28._4_4_;
          dVar19 = auVar20._0_8_ + (double)iVar12;
          dVar29 = auVar20._8_8_ + (double)iVar13;
          pNVar18->Latitude =
               (double)(~auVar23._0_8_ & (ulong)-dVar19 | (ulong)dVar19 & auVar23._0_8_);
          pNVar18->Longitude =
               (double)(~auVar23._8_8_ & (ulong)-dVar29 | (ulong)dVar29 & auVar23._8_8_);
        }
        auVar26._8_8_ = pNVar18->cog * 3.141592653589793;
        auVar26._0_8_ = pNVar18->sog;
        auVar28 = divpd(auVar26,_DAT_0018d530);
        pNVar18->SOG = (double)auVar28._0_8_;
        pNVar18->COG = (double)auVar28._8_8_;
        if (0.0 < pNVar18->date) {
          iVar12 = (int)pNVar18->date;
          pNVar18->day = iVar12 / 10000;
          iVar13 = (iVar12 / 10000) * -100 + iVar12 / 100;
          pNVar18->month = iVar13;
          pNVar18->year = iVar12 % 10000 + iVar13 * -100 + 2000;
        }
      }
      pcVar17 = local_1920;
      if (pNMEADevice->bEnableGPGLL != 0) {
        local_19d0 = pNVar18->szlatdeg;
        pcVar14 = pNVar18->szlongdeg;
        local_19b0 = pNVar18->szlongdeg + 1;
        pNVar18->szlongdeg[0] = '\0';
        pNVar18->szlongdeg[1] = '\0';
        pNVar18->szlongdeg[2] = '\0';
        pNVar18->szlongdeg[3] = '\0';
        local_19c8 = &pNVar18->status;
        pNVar18->szlatdeg[0] = '\0';
        pNVar18->szlatdeg[1] = '\0';
        pNVar18->szlatdeg[2] = '\0';
        pNVar18->szlongdeg[0] = '\0';
        iVar12 = __isoc99_sscanf(local_1920,"$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c",local_19d0,
                                 pNVar18->szlatdeg + 1,&pNVar18->latmin,&pNVar18->north,pcVar14,
                                 local_19b0,pNVar18->szlongdeg + 2,&pNVar18->longmin,&pNVar18->east,
                                 pNVar18,local_19c8);
        if (((iVar12 != 0xb) &&
            (iVar12 = __isoc99_sscanf(pcVar17,"$GPGLL,,,,,%lf,%c",local_19c0,local_19c8),
            iVar12 != 2)) &&
           (iVar12 = __isoc99_sscanf(pcVar17,"$GPGLL,,,,,,%c",local_19c8), iVar12 != 1))
        goto LAB_00146c8b;
        if ((*local_19d0 != '\0') && (*pcVar14 != '\0')) {
          iVar12 = atoi(local_19d0);
          pNVar18 = local_19c0;
          local_19c0->latdeg = iVar12;
          iVar13 = atoi(pcVar14);
          pNVar18->longdeg = iVar13;
          uVar8 = pNVar18->north;
          uVar11 = pNVar18->east;
          auVar24[0] = -(uVar8 == 'N');
          auVar24[1] = -(uVar8 == 'N');
          auVar24[2] = -(uVar11 == 'E');
          auVar24[3] = -(uVar11 == 'E');
          auVar24[4] = 0xff;
          auVar24[5] = 0xff;
          auVar24[6] = 0xff;
          auVar24[7] = 0xff;
          auVar24[8] = 0xff;
          auVar24[9] = 0xff;
          auVar24[10] = 0xff;
          auVar24[0xb] = 0xff;
          auVar24[0xc] = 0xff;
          auVar24[0xd] = 0xff;
          auVar24[0xe] = 0xff;
          auVar24[0xf] = 0xff;
          auVar28 = pshuflw(auVar24,auVar24,0x50);
          auVar5._0_8_ = pNVar18->latmin;
          auVar5._8_8_ = pNVar18->longmin;
          auVar20 = divpd(auVar5,_DAT_0018d520);
          auVar25._0_8_ = CONCAT44(auVar28._0_4_,auVar28._0_4_);
          auVar25._8_4_ = auVar28._4_4_;
          auVar25._12_4_ = auVar28._4_4_;
          dVar19 = auVar20._0_8_ + (double)iVar12;
          dVar29 = auVar20._8_8_ + (double)iVar13;
          pNVar18->Latitude =
               (double)(~auVar25._0_8_ & (ulong)-dVar19 | (ulong)dVar19 & auVar25._0_8_);
          pNVar18->Longitude =
               (double)(~auVar25._8_8_ & (ulong)-dVar29 | (ulong)dVar29 & auVar25._8_8_);
        }
        dVar19 = local_19c0->utc;
        pNVar18 = local_19c0;
        if (0.0 < dVar19) {
          iVar12 = (int)dVar19 / 10000;
          local_19c0->hour = iVar12;
          iVar13 = iVar12 * -100 + (int)dVar19 / 100;
          local_19c0->minute = iVar13;
          local_19c0->second = (dVar19 - (double)(iVar12 * 10000)) - (double)(iVar13 * 100);
        }
      }
      pcVar17 = local_1928;
      if (pNMEADevice->bEnableGPVTG != 0) {
        pdVar2 = &pNVar18->cog;
        pdVar3 = &pNVar18->sog;
        iVar12 = __isoc99_sscanf(local_1928,"$GPVTG,%lf,T,%lf,M,%lf,N",pdVar2,&pNVar18->mag_cog,
                                 pdVar3);
        if (((iVar12 != 3) &&
            (iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,%lf,T,,M,%lf,N",pdVar2,pdVar3), iVar12 != 2))
           && ((iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,%lf,T,,,%lf,N",pdVar2,pdVar3), iVar12 != 2
               && ((((iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,nan,T,nan,M,%lf,N",pdVar3),
                     iVar12 != 1 &&
                     (iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,NAN,T,NAN,M,%lf,N",pdVar3),
                     iVar12 != 1)) &&
                    (iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,NaN,T,NaN,M,%lf,N",pdVar3),
                    iVar12 != 1)) &&
                   ((iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,nan,T,,,%lf,N",pdVar3), iVar12 != 1 &&
                    (iVar12 = __isoc99_sscanf(pcVar17,"$GPVTG,NAN,T,,,%lf,N",pdVar3), iVar12 != 1)))
                   ))))) {
          __isoc99_sscanf(pcVar17,"$GPVTG,NaN,T,,,%lf,N",pdVar3);
        }
        auVar27._8_8_ = pNVar18->cog * 3.141592653589793;
        auVar27._0_8_ = pNVar18->sog;
        auVar28 = divpd(auVar27,_DAT_0018d530);
        pNVar18->SOG = (double)auVar28._0_8_;
        pNVar18->COG = (double)auVar28._8_8_;
      }
      if (pNMEADevice->bEnableHCHDG != 0) {
        __isoc99_sscanf(local_1950,"$HCHDG,%lf,%lf,%c,%lf,%c",&pNVar18->heading,&pNVar18->deviation,
                        &pNVar18->dev_east,&pNVar18->variation,&pNVar18->var_east);
        pNVar18->Heading = (pNVar18->heading * 3.141592653589793) / 180.0;
      }
      if (pNMEADevice->bEnableIIMWV != 0) {
        pdVar2 = &pNVar18->awindspeed;
        iVar12 = __isoc99_sscanf(local_1958,"$IIMWV,%lf,R,%lf,%c,A",&pNVar18->awinddir,pdVar2,
                                 &pNVar18->cawindspeed);
        if (iVar12 != 3) goto LAB_00146c8b;
        pNVar18->ApparentWindDir = (pNVar18->awinddir * 3.141592653589793) / 180.0;
        switch(pNVar18->cawindspeed) {
        case 'K':
          dVar19 = *pdVar2 * 0.28;
          break;
        default:
          goto switchD_00146bbf_caseD_4c;
        case 'M':
          dVar19 = *pdVar2;
          break;
        case 'N':
          dVar19 = *pdVar2 * 0.51;
          break;
        case 'S':
          dVar19 = *pdVar2 * 0.45;
        }
        local_19c0->ApparentWindSpeed = dVar19;
        pNVar18 = local_19c0;
      }
switchD_00146bbf_caseD_4c:
      if (pNMEADevice->bEnableWIMWV != 0) {
        pdVar2 = &pNVar18->awindspeed;
        iVar12 = __isoc99_sscanf(local_1960,"$WIMWV,%lf,R,%lf,%c,A",&pNVar18->awinddir,pdVar2,
                                 &pNVar18->cawindspeed);
        if (iVar12 != 3) goto LAB_00146c8b;
        local_19c0->ApparentWindDir = (local_19c0->awinddir * 3.141592653589793) / 180.0;
        pNVar18 = local_19c0;
        switch(local_19c0->cawindspeed) {
        case 'K':
          dVar19 = *pdVar2 * 0.28;
          break;
        default:
          goto switchD_00146c7b_caseD_4c;
        case 'M':
          dVar19 = *pdVar2;
          break;
        case 'N':
          dVar19 = *pdVar2 * 0.51;
          break;
        case 'S':
          dVar19 = *pdVar2 * 0.45;
        }
        local_19c0->ApparentWindSpeed = dVar19;
      }
switchD_00146c7b_caseD_4c:
      if (pNMEADevice->bEnableWIMWD != 0) {
        __isoc99_sscanf(local_1968,"$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&pNVar18->winddir,
                        &pNVar18->cwinddir,&f1,&c1,&f2,&c2,&pNVar18->windspeed,&pNVar18->cwindspeed)
        ;
        pNVar18->WindDir = (pNVar18->winddir * 3.141592653589793) / 180.0;
        pNVar18->WindSpeed = pNVar18->windspeed;
      }
      pNVar18 = local_19c0;
      if (pNMEADevice->bEnableWIMDA != 0) {
        __isoc99_sscanf(local_1970,"$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c",
                        &f0,&c0,&local_19c0->pressure,&local_19c0->cpressure,
                        &local_19c0->temperature,&local_19c0->ctemperature,&local_19c0->winddir,
                        &local_19c0->cwinddir,&f1,&c1,&f2,&c2,&local_19c0->windspeed,
                        &local_19c0->cwindspeed);
        pNVar18->WindDir = (pNVar18->winddir * 3.141592653589793) / 180.0;
        pNVar18->WindSpeed = pNVar18->windspeed;
      }
      pNVar18 = local_19c0;
      if (pNMEADevice->bEnableAIVDM == 0) goto LAB_00146f24;
      aisbuf[0x70] = '\0';
      aisbuf[0x71] = '\0';
      aisbuf[0x72] = '\0';
      aisbuf[0x73] = '\0';
      aisbuf[0x74] = '\0';
      aisbuf[0x75] = '\0';
      aisbuf[0x76] = '\0';
      aisbuf[0x77] = '\0';
      aisbuf[0x78] = '\0';
      aisbuf[0x79] = '\0';
      aisbuf[0x7a] = '\0';
      aisbuf[0x7b] = '\0';
      aisbuf[0x7c] = '\0';
      aisbuf[0x7d] = '\0';
      aisbuf[0x7e] = '\0';
      aisbuf[0x7f] = '\0';
      aisbuf[0x60] = '\0';
      aisbuf[0x61] = '\0';
      aisbuf[0x62] = '\0';
      aisbuf[99] = '\0';
      aisbuf[100] = '\0';
      aisbuf[0x65] = '\0';
      aisbuf[0x66] = '\0';
      aisbuf[0x67] = '\0';
      aisbuf[0x68] = '\0';
      aisbuf[0x69] = '\0';
      aisbuf[0x6a] = '\0';
      aisbuf[0x6b] = '\0';
      aisbuf[0x6c] = '\0';
      aisbuf[0x6d] = '\0';
      aisbuf[0x6e] = '\0';
      aisbuf[0x6f] = '\0';
      aisbuf[0x50] = '\0';
      aisbuf[0x51] = '\0';
      aisbuf[0x52] = '\0';
      aisbuf[0x53] = '\0';
      aisbuf[0x54] = '\0';
      aisbuf[0x55] = '\0';
      aisbuf[0x56] = '\0';
      aisbuf[0x57] = '\0';
      aisbuf[0x58] = '\0';
      aisbuf[0x59] = '\0';
      aisbuf[0x5a] = '\0';
      aisbuf[0x5b] = '\0';
      aisbuf[0x5c] = '\0';
      aisbuf[0x5d] = '\0';
      aisbuf[0x5e] = '\0';
      aisbuf[0x5f] = '\0';
      aisbuf[0x40] = '\0';
      aisbuf[0x41] = '\0';
      aisbuf[0x42] = '\0';
      aisbuf[0x43] = '\0';
      aisbuf[0x44] = '\0';
      aisbuf[0x45] = '\0';
      aisbuf[0x46] = '\0';
      aisbuf[0x47] = '\0';
      aisbuf[0x48] = '\0';
      aisbuf[0x49] = '\0';
      aisbuf[0x4a] = '\0';
      aisbuf[0x4b] = '\0';
      aisbuf[0x4c] = '\0';
      aisbuf[0x4d] = '\0';
      aisbuf[0x4e] = '\0';
      aisbuf[0x4f] = '\0';
      aisbuf[0x30] = '\0';
      aisbuf[0x31] = '\0';
      aisbuf[0x32] = '\0';
      aisbuf[0x33] = '\0';
      aisbuf[0x34] = '\0';
      aisbuf[0x35] = '\0';
      aisbuf[0x36] = '\0';
      aisbuf[0x37] = '\0';
      aisbuf[0x38] = '\0';
      aisbuf[0x39] = '\0';
      aisbuf[0x3a] = '\0';
      aisbuf[0x3b] = '\0';
      aisbuf[0x3c] = '\0';
      aisbuf[0x3d] = '\0';
      aisbuf[0x3e] = '\0';
      aisbuf[0x3f] = '\0';
      aisbuf[0x20] = '\0';
      aisbuf[0x21] = '\0';
      aisbuf[0x22] = '\0';
      aisbuf[0x23] = '\0';
      aisbuf[0x24] = '\0';
      aisbuf[0x25] = '\0';
      aisbuf[0x26] = '\0';
      aisbuf[0x27] = '\0';
      aisbuf[0x28] = '\0';
      aisbuf[0x29] = '\0';
      aisbuf[0x2a] = '\0';
      aisbuf[0x2b] = '\0';
      aisbuf[0x2c] = '\0';
      aisbuf[0x2d] = '\0';
      aisbuf[0x2e] = '\0';
      aisbuf[0x2f] = '\0';
      aisbuf[0x10] = '\0';
      aisbuf[0x11] = '\0';
      aisbuf[0x12] = '\0';
      aisbuf[0x13] = '\0';
      aisbuf[0x14] = '\0';
      aisbuf[0x15] = '\0';
      aisbuf[0x16] = '\0';
      aisbuf[0x17] = '\0';
      aisbuf[0x18] = '\0';
      aisbuf[0x19] = '\0';
      aisbuf[0x1a] = '\0';
      aisbuf[0x1b] = '\0';
      aisbuf[0x1c] = '\0';
      aisbuf[0x1d] = '\0';
      aisbuf[0x1e] = '\0';
      aisbuf[0x1f] = '\0';
      aisbuf[0] = '\0';
      aisbuf[1] = '\0';
      aisbuf[2] = '\0';
      aisbuf[3] = '\0';
      aisbuf[4] = '\0';
      aisbuf[5] = '\0';
      aisbuf[6] = '\0';
      aisbuf[7] = '\0';
      aisbuf[8] = '\0';
      aisbuf[9] = '\0';
      aisbuf[10] = '\0';
      aisbuf[0xb] = '\0';
      aisbuf[0xc] = '\0';
      aisbuf[0xd] = '\0';
      aisbuf[0xe] = '\0';
      aisbuf[0xf] = '\0';
      piVar1 = &local_19c0->sentence_number;
      __isoc99_sscanf(local_1978,"!AIVDM,%d,%d,,%c,%127s",&local_19c0->nbsentences,piVar1,
                      &local_19c0->AIS_channel);
      if ((pNVar18->nbsentences != 1) || (*piVar1 != 1)) goto LAB_00146f24;
      piVar1 = &local_19c0->nbfillbits;
      lVar16 = 0;
      goto LAB_00146ea8;
    }
    dVar19 = GetTimeElapsedChronoQuick(&chrono);
    if (4.0 < dVar19) {
LAB_001460c6:
      puts("Error reading data from a NMEADevice : Message timeout. ");
      return 2;
    }
    if (0xffe < iVar12) {
      puts("Error reading data from a NMEADevice : Invalid data. ");
      return 4;
    }
    iVar13 = ReadRS232Port(&pNMEADevice->RS232Port,(uint8 *)(recvbuf + iVar12),0xfff - iVar12,&Bytes
                          );
    if (iVar13 == 0) {
      if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + iVar12,(long)Bytes,1,(FILE *)pNMEADevice->pfSaveFile);
        fflush((FILE *)pNMEADevice->pfSaveFile);
      }
      iVar12 = iVar12 + Bytes;
      if (pNMEADevice->bEnableGPGGA != 0) {
        pcVar17 = FindLatestNMEASentence("$GPGGA",recvbuf);
      }
      if (pNMEADevice->bEnableGPRMC != 0) {
        local_19b0 = FindLatestNMEASentence("$GPRMC",recvbuf);
      }
      if (pNMEADevice->bEnableGPGLL != 0) {
        local_1920 = FindLatestNMEASentence("$GPGLL",recvbuf);
      }
      if (pNMEADevice->bEnableGPVTG != 0) {
        local_1928 = FindLatestNMEASentence("$GPVTG",recvbuf);
      }
      if (pNMEADevice->bEnableHCHDG != 0) {
        local_1950 = FindLatestNMEASentence("$HCHDG",recvbuf);
      }
      if (pNMEADevice->bEnableIIMWV != 0) {
        local_1958 = FindLatestNMEASentence("$IIMWV",recvbuf);
      }
      if (pNMEADevice->bEnableWIMWV != 0) {
        local_1960 = FindLatestNMEASentence("$WIMWV",recvbuf);
      }
      if (pNMEADevice->bEnableWIMWD != 0) {
        local_1968 = FindLatestNMEASentence("$WIMWD",recvbuf);
      }
      if (pNMEADevice->bEnableWIMDA != 0) {
        local_1970 = FindLatestNMEASentence("$WIMDA",recvbuf);
      }
      if (pNMEADevice->bEnableAIVDM != 0) {
        local_1978 = FindLatestNMEASentence("!AIVDM",recvbuf);
      }
      goto LAB_00145e1e;
    }
  }
LAB_00145ae6:
  pcVar17 = "Error reading data from a NMEADevice. ";
LAB_00145aed:
  puts(pcVar17);
  return 1;
LAB_00146ea8:
  if ((lVar16 == 0x7f) || (aisbuf[lVar16] == '\0')) goto LAB_00146f24;
  iVar12 = __isoc99_sscanf(aisbuf + lVar16,",%d",piVar1);
  if (iVar12 == 1) {
    memset(aisbuf + lVar16,0,0x80 - lVar16);
    if (lVar16 != 0) {
      decode_AIS(aisbuf,(int)lVar16,&local_19c0->AIS_Latitude,&local_19c0->AIS_Longitude,
                 &local_19c0->AIS_SOG,&local_19c0->AIS_COG);
    }
LAB_00146f24:
    memcpy(&pNMEADevice->LastNMEAData,local_19c0,0x3d8);
    return 0;
  }
  lVar16 = lVar16 + 1;
  goto LAB_00146ea8;
}

Assistant:

inline int GetLatestDataNMEADevice(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	char recvbuf[2*MAX_NB_BYTES_NMEADEVICE];
	char savebuf[MAX_NB_BYTES_NMEADEVICE];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_GPGGA = NULL;
	char* ptr_GPRMC = NULL;
	char* ptr_GPGLL = NULL;
	char* ptr_GPVTG = NULL;
	char* ptr_HCHDG = NULL;
	char* ptr_IIMWV = NULL;
	char* ptr_WIMWV = NULL;
	char* ptr_WIMWD = NULL;
	char* ptr_WIMDA = NULL;
	char* ptr_AIVDM = NULL;
	// Temporary buffers for sscanf().
	char c0 = 0, c1 = 0, c2 = 0;
	double f0 = 0, f1 = 0, f2 = 0;
	char aisbuf[128];
	int aisbuflen = 0;
	int i = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_NMEADEVICE-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a NMEADevice. \n");
		return EXIT_FAILURE;
	}
	if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
		fflush(pNMEADevice->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
			{
				printf("Error reading data from a NMEADevice : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a NMEADevice. \n");
				return EXIT_FAILURE;
			}
			if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
				fflush(pNMEADevice->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
	if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
	if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
	if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
	if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
	if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
	if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
	if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);

	while (
		(pNMEADevice->bEnableGPGGA&&!ptr_GPGGA)||
		(pNMEADevice->bEnableGPRMC&&!ptr_GPRMC)||
		(pNMEADevice->bEnableGPGLL&&!ptr_GPGLL)||
		(pNMEADevice->bEnableGPVTG&&!ptr_GPVTG)||
		(pNMEADevice->bEnableHCHDG&&!ptr_HCHDG)||
		(pNMEADevice->bEnableIIMWV&&!ptr_IIMWV)||
		(pNMEADevice->bEnableWIMWV&&!ptr_WIMWV)||
		(pNMEADevice->bEnableWIMWD&&!ptr_WIMWD)||
		(pNMEADevice->bEnableWIMDA&&!ptr_WIMDA)||
		(pNMEADevice->bEnableAIVDM&&!ptr_AIVDM)
		)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
		{
			printf("Error reading data from a NMEADevice : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_NMEADEVICE-1)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_NMEADEVICE-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a NMEADevice. \n");
			return EXIT_FAILURE;
		}
		if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pNMEADevice->pfSaveFile);
			fflush(pNMEADevice->pfSaveFile);
		}
		BytesReceived += Bytes;
		if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
		if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
		if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
		if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
		if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
		if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
		if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
		if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);
	}

	// Analyze data.

	memset(pNMEAData, 0, sizeof(NMEADATA));

	// GPS essential fix data.
	if (pNMEADevice->bEnableGPGGA)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude, &pNMEAData->height_geoid) != 15)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude) != 14)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator) != 11)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,,,,,%d", &pNMEAData->utc, &pNMEAData->GPS_quality_indicator) != 2)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,,,,,,%d", &pNMEAData->GPS_quality_indicator) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}
	}

	// GPS recommended minimum data.
	if (pNMEADevice->bEnableGPRMC)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date, &pNMEAData->variation, &pNMEAData->var_east) != 16)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date) != 14)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east) != 11)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,,%c", &pNMEAData->status) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;

		if (pNMEAData->date > 0)
		{
			pNMEAData->day = (int)pNMEAData->date/10000;
			pNMEAData->month = (int)pNMEAData->date/100-pNMEAData->day*100;
			pNMEAData->year = 2000+((int)pNMEAData->date-pNMEAData->day*10000)-pNMEAData->month*100;
		}
	}

	// GPS position, latitude / longitude and time.
	if (pNMEADevice->bEnableGPGLL)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if ((sscanf(ptr_GPGLL, "$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c", 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east, 
			&pNMEAData->utc, &pNMEAData->status) != 11)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,,%c", &pNMEAData->status) != 1))
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}
	}

	// GPS COG and SOG.
	if (pNMEADevice->bEnableGPVTG)
	{
		if ((sscanf(ptr_GPVTG, "$GPVTG,%lf,T,%lf,M,%lf,N", &pNMEAData->cog, &pNMEAData->mag_cog, &pNMEAData->sog) != 3)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,M,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,nan,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,NAN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,NaN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,,,%lf,N", &pNMEAData->sog) != 1))
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;
	}

	// Heading data.
	if (pNMEADevice->bEnableHCHDG)
	{
		if (sscanf(ptr_HCHDG, "$HCHDG,%lf,%lf,%c,%lf,%c", 
			&pNMEAData->heading, &pNMEAData->deviation, &pNMEAData->dev_east, &pNMEAData->variation, &pNMEAData->var_east) != 5)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert heading to angle in rad.
		pNMEAData->Heading = pNMEAData->heading*M_PI/180.0;
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableIIMWV)
	{
		if (sscanf(ptr_IIMWV, "$IIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableWIMWV)
	{
		if (sscanf(ptr_WIMWV, "$WIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind direction and speed, with respect to north.
	if (pNMEADevice->bEnableWIMWD)
	{
		if (sscanf(ptr_WIMWD, "$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 8)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// Meteorological composite data.
	if (pNMEADevice->bEnableWIMDA)
	{
		if (sscanf(ptr_WIMDA, "$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&f0, &c0, &pNMEAData->pressure, &pNMEAData->cpressure, &pNMEAData->temperature, &pNMEAData->ctemperature,  
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 14)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// AIS data.
	if (pNMEADevice->bEnableAIVDM)
	{
		memset(aisbuf, 0, sizeof(aisbuf));
		if (sscanf(ptr_AIVDM, "!AIVDM,%d,%d,,%c,%127s", 
			&pNMEAData->nbsentences, &pNMEAData->sentence_number, &pNMEAData->AIS_channel, aisbuf) != 4)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Only the most simple AIS messages are handled...
		if ((pNMEAData->nbsentences == 1)&&(pNMEAData->sentence_number == 1))
		{
			i = 0;
			// Search for the end of the AIS data payload.
			while ((i < (int)sizeof(aisbuf)-1)&&(aisbuf[i] != 0))
			{
				if (sscanf(aisbuf+i, ",%d", &pNMEAData->nbfillbits) == 1) 
				{
					aisbuflen = i;
					// Fill with 0 the rest of the buffer to keep only the AIS data payload in aisbuf.
					memset(aisbuf+i, 0, sizeof(aisbuf)-i);
					break;
				}
				i++;
			}
			if (aisbuflen != 0)
			{
				// Temporary...
#if defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
				decode_AIS(aisbuf, aisbuflen, &pNMEAData->AIS_Latitude, &pNMEAData->AIS_Longitude, &pNMEAData->AIS_SOG, &pNMEAData->AIS_COG);
#endif // defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
			}
			else
			{
				//printf("Error reading data from a NMEADevice : Invalid data. \n");
				//return EXIT_FAILURE;
			}
		}
		else
		{
			// Unhandled...
		}
	}

	pNMEADevice->LastNMEAData = *pNMEAData;

	return EXIT_SUCCESS;
}